

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_bcast_qtree_single
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,void *src,void *dst,bsc_size_t size,
          bsc_pid_t q)

{
  long lVar1;
  int iVar2;
  bsp_pid_t bVar3;
  int iVar4;
  int iVar5;
  bsc_pid_t local_70;
  int local_5c;
  bsc_pid_t me;
  bsc_pid_t r;
  bsc_pid_t range;
  bsc_pid_t P;
  bsc_pid_t j;
  bsc_pid_t i;
  group_t *g;
  bsc_size_t size_local;
  void *dst_local;
  void *src_local;
  bsc_group_t group_local;
  bsp_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    iVar2 = bsp_nprocs();
    local_5c = bsp_pid();
  }
  else {
    iVar2 = *group;
    root = *(int *)(*(long *)((long)group + 8) + (long)root * 4);
    lVar1 = *(long *)((long)group + 8);
    bVar3 = bsp_pid();
    local_5c = *(int *)(lVar1 + (long)bVar3 * 4);
  }
  iVar5 = ((local_5c + iVar2) - root) % iVar2;
  if ((iVar5 == 0) && (dst != src)) {
    memcpy(dst,src,(long)size);
  }
  group_local._4_4_ = depends;
  for (me = 1; me < iVar2; me = q * me) {
    if (iVar5 < me) {
      for (P = 1; P < q; P = P + 1) {
        iVar4 = P * me + iVar5;
        if (iVar4 < iVar2) {
          local_70 = (iVar4 + root) % iVar2;
          if (group != (bsc_group_t)0x0) {
            local_70 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)local_70 * 4);
          }
          bsc_put(group_local._4_4_,local_70,dst,dst,0,size);
        }
      }
    }
    group_local._4_4_ = group_local._4_4_ + 1;
  }
  return group_local._4_4_;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_bcast_qtree_single( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      const void * src, void * dst, bsc_size_t size,
                      bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, r = g?g->lid[root]:root;
    bsc_pid_t me = ((g?g->lid[ bsp_pid() ] : bsp_pid()) + P - r) %P;

    if ( me == 0 && dst != src ) 
        memcpy( dst, src, size ); 

    for (range = 1; range < P; range *= q ) {
        if ( me < range ) {
            for ( i = 1 ; i < q; ++i) {
                j = i * range + me; 
                if (j < P) {
                    j = ( j + r ) % P;
                    bsc_put( depends, g?g->gid[j]:j, dst, dst, 0, size );
                }
            }
        }
        depends += 1;
    }
    return depends;
}